

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathLine.h
# Opt level: O2

Vec3<float> __thiscall Imath_3_2::Line3<float>::operator()(Line3<float> *this,float parameter)

{
  undefined8 *in_RSI;
  Vec3<float> VVar1;
  
  VVar1.z = *(float *)((long)in_RSI + 0x14) * parameter + *(float *)(in_RSI + 1);
  VVar1.x = parameter * (float)*(undefined8 *)((long)in_RSI + 0xc) + (float)*in_RSI;
  VVar1.y = parameter * (float)((ulong)*(undefined8 *)((long)in_RSI + 0xc) >> 0x20) +
            (float)((ulong)*in_RSI >> 0x20);
  (this->pos).x = VVar1.x;
  (this->pos).y = VVar1.y;
  (this->pos).z = VVar1.z;
  return VVar1;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Vec3<T>
Line3<T>::operator() (T parameter) const IMATH_NOEXCEPT
{
    return pos + dir * parameter;
}